

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  const_reference pvVar9;
  long lVar10;
  long lVar11;
  idx_t iVar12;
  long lVar13;
  idx_t iVar14;
  long lVar15;
  long lVar16;
  idx_t iVar17;
  idx_t iVar18;
  bool bVar19;
  interval_t *lhs_data;
  uchar **rhs_locations;
  idx_t local_80;
  idx_t local_78;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      local_78 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      local_80 = 0;
      iVar18 = 0;
      do {
        iVar17 = iVar18;
        if (psVar5 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar5[iVar18];
        }
        iVar14 = iVar17;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar17];
        }
        lVar8 = *(long *)(pdVar3 + iVar17 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_015ba217:
          *no_match_count = local_78 + 1;
          no_match_sel->sel_vector[local_78] = (sel_t)iVar17;
          local_78 = local_78 + 1;
        }
        else {
          lVar10 = *(long *)(lVar8 + vVar4);
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar13 = iVar14 * 0x10;
          lVar11 = (lVar10 >> 0x20) + lVar8 / 86400000000;
          lVar16 = lVar11 % 0x1e;
          lVar11 = (long)(int)lVar10 + lVar11 / 0x1e;
          lVar15 = (long)*(int *)(pdVar1 + lVar13 + 4) +
                   *(long *)(pdVar1 + lVar13 + 8) / 86400000000;
          lVar10 = lVar15 % 0x1e;
          lVar15 = (long)*(int *)(pdVar1 + lVar13) + lVar15 / 0x1e;
          if ((lVar11 <= lVar15) &&
             ((lVar11 < lVar15 ||
              ((lVar16 <= lVar10 &&
               ((lVar16 < lVar10 ||
                (lVar8 % 86400000000 <= *(long *)(pdVar1 + lVar13 + 8) % 86400000000))))))))
          goto LAB_015ba217;
          psVar5[local_80] = (sel_t)iVar17;
          local_80 = local_80 + 1;
        }
        iVar18 = iVar18 + 1;
        if (count == iVar18) {
          return local_80;
        }
      } while( true );
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_80 = 0;
      iVar17 = 0;
      iVar18 = *no_match_count;
      do {
        iVar14 = iVar17;
        if (psVar5 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar5[iVar17];
        }
        iVar12 = iVar14;
        if (psVar6 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar6[iVar14];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar19 = false;
        }
        else {
          bVar19 = (puVar7[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) == 0;
        }
        if ((bVar19) ||
           (lVar8 = *(long *)(pdVar1 + iVar14 * 8),
           ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_015ba04c:
          iVar12 = iVar18 + 1;
          *no_match_count = iVar12;
          no_match_sel->sel_vector[iVar18] = (sel_t)iVar14;
        }
        else {
          lVar10 = *(long *)(lVar8 + vVar4);
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar13 = iVar12 * 0x10;
          lVar15 = (lVar10 >> 0x20) + lVar8 / 86400000000;
          lVar11 = lVar15 % 0x1e;
          lVar16 = (long)(int)lVar10 + lVar15 / 0x1e;
          lVar15 = (long)*(int *)(pdVar3 + lVar13 + 4) +
                   *(long *)(pdVar3 + lVar13 + 8) / 86400000000;
          lVar10 = lVar15 % 0x1e;
          lVar15 = (long)*(int *)(pdVar3 + lVar13) + lVar15 / 0x1e;
          if ((lVar16 <= lVar15) &&
             ((lVar16 < lVar15 ||
              ((lVar11 <= lVar10 &&
               ((lVar11 < lVar10 ||
                (lVar8 % 86400000000 <= *(long *)(pdVar3 + lVar13 + 8) % 86400000000))))))))
          goto LAB_015ba04c;
          psVar5[local_80] = (sel_t)iVar14;
          local_80 = local_80 + 1;
          iVar12 = iVar18;
        }
        iVar17 = iVar17 + 1;
        iVar18 = iVar12;
        if (count == iVar17) {
          return local_80;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}